

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O3

bool __thiscall StimulationCommand::setGroup(StimulationCommand *this,int groupNum)

{
  if ((uint)groupNum < 0x20) {
    this->_group = (byte)groupNum | 0x80;
  }
  return (uint)groupNum < 0x20;
}

Assistant:

bool StimulationCommand::setGroup(int groupNum) {
//    std::cerr << "set group " << groupNum << "\n";
    //Set the trigger group. Multiple slots can belong to the same trigger group, and can be triggered together.
    //bits 4-0 has the group number (up to 31), bit 5=0, bit 6=0, bit 7 has trigger enable)
    if (groupNum > 31) return false;
    if (groupNum < 0) return false;

    _group = 0x1F & groupNum; //set bits 0-4 to the group number
    _group |= 0x80; //set bit 7 to 1

    return true;

}